

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

bool __thiscall spdlog::logger::should_log(logger *this,level_enum msg_level)

{
  level_enum msg_level_local;
  logger *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->level_).super___atomic_base<int>._M_i <= (int)msg_level;
}

Assistant:

bool should_log(level::level_enum msg_level) const
    {
        return msg_level >= level_.load(std::memory_order_relaxed);
    }